

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDToBrepParameters::Compare(ON_SubDToBrepParameters *lhs,ON_SubDToBrepParameters *rhs)

{
  bool bVar1;
  bool bVar2;
  uint b;
  uint a;
  ON_SubDToBrepParameters *rhs_local;
  ON_SubDToBrepParameters *lhs_local;
  
  bVar1 = (lhs->m_bPackFaces & 1U) != 0;
  bVar2 = (rhs->m_bPackFaces & 1U) != 0;
  if (bVar1 < bVar2) {
    lhs_local._4_4_ = -1;
  }
  else if (bVar2 < bVar1) {
    lhs_local._4_4_ = 1;
  }
  else if (lhs->m_extraordinary_vertex_process < rhs->m_extraordinary_vertex_process) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->m_extraordinary_vertex_process < lhs->m_extraordinary_vertex_process) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = 0;
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDToBrepParameters::Compare(
  const ON_SubDToBrepParameters& lhs,
  const ON_SubDToBrepParameters& rhs
)
{
  unsigned int a = lhs.m_bPackFaces ? 1 : 0;
  unsigned int b = rhs.m_bPackFaces ? 1 : 0;
  if (a < b)
    return -1;
  if (a > b)
    return 1;

  a = static_cast<unsigned char>(lhs.m_extraordinary_vertex_process);
  b = static_cast<unsigned char>(rhs.m_extraordinary_vertex_process);
  if (a < b)
    return -1;
  if (a > b)
    return 1;

  return 0;
}